

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

Type __thiscall capnp::StructSchema::Field::getType(Field *this)

{
  short sVar1;
  uint uVar2;
  void *pvVar3;
  Reader proto;
  anon_union_8_2_eba6ea51_for_Type_5 aVar4;
  uint location;
  uint64_t id;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Type TVar8;
  PointerReader local_68;
  StructReader local_48;
  
  uVar6 = *(undefined4 *)&(this->proto)._reader.segment;
  uVar7 = *(undefined4 *)((long)&(this->proto)._reader.segment + 4);
  local_68.capTable._0_4_ = *(undefined4 *)&(this->proto)._reader.capTable;
  local_68.capTable._4_4_ = *(undefined4 *)((long)&(this->proto)._reader.capTable + 4);
  uVar2 = (this->proto)._reader.dataSize;
  local_68.nestingLimit = (this->proto)._reader.nestingLimit;
  location = this->index | 0x1000000;
  if (0x4f < uVar2) {
    pvVar3 = (this->proto)._reader.data;
    sVar1 = *(short *)((long)pvVar3 + 8);
    if (sVar1 == 1) {
      if (uVar2 < 0xc0) {
        id = 0;
      }
      else {
        id = *(uint64_t *)((long)pvVar3 + 0x10);
      }
      local_68.segment = (SegmentReader *)Schema::getDependency((Schema *)this,id,location);
      aVar4 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asStruct((Schema *)&local_68);
      TVar8.field_4 =
           (anon_union_8_2_eba6ea51_for_Type_5)(anon_union_8_2_eba6ea51_for_Type_5)aVar4.schema;
      TVar8.baseType = STRUCT;
      TVar8.listDepth = '\0';
      TVar8.isImplicitParam = false;
      TVar8.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      TVar8._6_2_ = 0;
      return TVar8;
    }
    if (sVar1 != 0) {
      kj::_::unreachable();
    }
  }
  bVar5 = (this->proto)._reader.pointerCount < 3;
  local_68.pointer = (this->proto)._reader.pointers + 2;
  if (bVar5) {
    local_68.pointer = (WirePointer *)0x0;
  }
  if (bVar5) {
    uVar6 = 0;
    uVar7 = 0;
    local_68.capTable._0_4_ = 0;
    local_68.capTable._4_4_ = 0;
    local_68.nestingLimit = 0x7fffffff;
  }
  local_68.segment = (SegmentReader *)CONCAT44(uVar7,uVar6);
  capnp::_::PointerReader::getStruct(&local_48,&local_68,(word *)0x0);
  proto._reader.capTable = local_48.capTable;
  proto._reader.segment = local_48.segment;
  proto._reader.data = local_48.data;
  proto._reader.pointers = local_48.pointers;
  proto._reader.dataSize = local_48.dataSize;
  proto._reader.pointerCount = local_48.pointerCount;
  proto._reader._38_2_ = local_48._38_2_;
  proto._reader.nestingLimit = local_48.nestingLimit;
  proto._reader._44_4_ = local_48._44_4_;
  TVar8 = Schema::interpretType((Schema *)this,proto,location);
  return TVar8;
}

Assistant:

Type StructSchema::Field::getType() const {
  auto proto = getProto();
  uint location = _::RawBrandedSchema::makeDepLocation(_::RawBrandedSchema::DepKind::FIELD, index);

  switch (proto.which()) {
    case schema::Field::SLOT:
      return parent.interpretType(proto.getSlot().getType(), location);

    case schema::Field::GROUP:
      return parent.getDependency(proto.getGroup().getTypeId(), location).asStruct();
  }
  KJ_UNREACHABLE;
}